

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLStateMachine.cpp
# Opt level: O1

string * __thiscall
SQLStateMachine::get_parse_key_abi_cxx11_
          (string *__return_storage_ptr__,SQLStateMachine *this,int state)

{
  pointer pcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int local_14;
  
  bVar2 = Map::
          Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::contains(&this->parse_states,&local_14);
  if (bVar2) {
    pbVar3 = Map::
             Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&this->parse_states,&local_14);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar3->_M_string_length);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SQLStateMachine::get_parse_key(int state) {
    if (parse_states.contains(state))
        return parse_states[state];
    else
        return "";
}